

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
 __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::connectToIntroduced
          (ConnectionImpl *this,Reader contact,Builder completion)

{
  ConnectionImpl *pCVar1;
  int iVar2;
  socklen_t __len;
  undefined8 uVar3;
  size_t __n;
  sockaddr *__addr;
  Connection *extraout_RDX;
  long in_RSI;
  ArrayPtr<const_char> AVar4;
  Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
  MVar5;
  DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> local_98;
  ConnectionImpl *local_68;
  StructReader local_60;
  
  local_98.right = (StringPtr *)(contact._reader.pointers + 1);
  if (contact._reader.pointerCount < 2) {
    local_98.right = (StringPtr *)(WirePointer *)0x0;
  }
  local_98.left.super_StringPtr.content.ptr._0_4_ = contact._reader.segment._0_4_;
  local_98.left.super_StringPtr.content.ptr._4_4_ = contact._reader.segment._4_4_;
  local_98.left.super_StringPtr.content.size_._0_4_ = contact._reader.capTable._0_4_;
  local_98.left.super_StringPtr.content.size_._4_4_ = contact._reader.capTable._4_4_;
  iVar2 = contact._reader.nestingLimit;
  if (contact._reader.pointerCount < 2) {
    local_98.left.super_StringPtr.content.ptr._0_4_ = 0;
    local_98.left.super_StringPtr.content.ptr._4_4_ = 0;
    local_98.left.super_StringPtr.content.size_._0_4_ = 0;
    local_98.left.super_StringPtr.content.size_._4_4_ = 0;
    iVar2 = 0x7fffffff;
  }
  local_98.op.content.ptr = (char *)CONCAT44(local_98.op.content.ptr._4_4_,iVar2);
  local_68 = this;
  AVar4 = (ArrayPtr<const_char>)
          PointerReader::getBlob<capnp::Text>((PointerReader *)&local_98,(void *)0x0,0);
  __n = AVar4.size_;
  if (__n == *(size_t *)(in_RSI + 0xc0)) {
    if (__n == 0) goto LAB_001fd609;
    iVar2 = bcmp(AVar4.ptr,(((StringPtr *)(in_RSI + 0xb8))->content).ptr,__n);
    local_98.op.content.ptr = (char *)0x0;
    local_98.op.content.size_ = 5;
    local_98.result = iVar2 == 0;
    if (local_98.result) goto LAB_001fd609;
  }
  else {
    local_98.result = false;
  }
  local_98.op.content.ptr = (char *)0x0;
  local_98.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3) {
    local_98.op.content.size_ = 5;
    local_98.op.content.ptr = " == ";
    local_98.left.super_StringPtr.content = (StringPtr)(StringPtr)AVar4;
    local_98.right = (StringPtr *)(in_RSI + 0xb8);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x1f2,ERROR,
               "\"failed: expected \" \"contact.getSentBy() == partnerName\", _kjCondition",
               (char (*) [52])"failed: expected contact.getSentBy() == partnerName",&local_98);
  }
LAB_001fd609:
  if (contact._reader.dataSize < 0x40) {
    uVar3 = 0;
  }
  else {
    uVar3 = *contact._reader.data;
  }
  *(undefined8 *)completion._builder.data = uVar3;
  uVar3 = *(undefined8 *)(in_RSI + 0x20);
  local_98.right = (StringPtr *)contact._reader.pointers;
  if (contact._reader.pointerCount == 0) {
    local_98.right = (StringPtr *)(WirePointer *)0x0;
  }
  local_98.left.super_StringPtr.content.ptr._0_4_ = 0;
  local_98.left.super_StringPtr.content.ptr._4_4_ = 0;
  local_98.left.super_StringPtr.content.size_._0_4_ = 0;
  local_98.left.super_StringPtr.content.size_._4_4_ = 0;
  __len = 0x7fffffff;
  if (contact._reader.pointerCount != 0) {
    local_98.left.super_StringPtr.content.ptr._0_4_ = contact._reader.segment._0_4_;
    local_98.left.super_StringPtr.content.ptr._4_4_ = contact._reader.segment._4_4_;
    local_98.left.super_StringPtr.content.size_._0_4_ = contact._reader.capTable._0_4_;
    local_98.left.super_StringPtr.content.size_._4_4_ = contact._reader.capTable._4_4_;
    __len = contact._reader.nestingLimit;
  }
  local_98.op.content.ptr = (char *)CONCAT44(local_98.op.content.ptr._4_4_,__len);
  PointerReader::getStruct(&local_60,(PointerReader *)&local_98,(word *)0x0);
  pCVar1 = local_68;
  connect((TestVat *)local_68,(int)uVar3,__addr,__len);
  MVar5.ptr.ptr = extraout_RDX;
  MVar5.ptr.disposer = (Disposer *)pCVar1;
  return (Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
          )MVar5.ptr;
}

Assistant:

kj::Maybe<kj::Own<Connection>> connectToIntroduced(
        test::TestThirdPartyToContact::Reader contact,
        test::TestThirdPartyCompletion::Builder completion) override {
      KJ_EXPECT(contact.getSentBy() == partnerName);
      completion.setToken(contact.getToken());
      return vat.connect(contact.getPath());
    }